

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar.c
# Opt level: O0

axbStatus_t axbScalarCreateBegin(axbHandle_s *handle,axbScalar_s **scalar)

{
  axbScalar_s *paVar1;
  char *pcVar2;
  axbScalar_s **scalar_local;
  axbHandle_s *handle_local;
  
  paVar1 = (axbScalar_s *)malloc(0x40);
  *scalar = paVar1;
  (*scalar)->handle = handle;
  (*scalar)->init = 0xdad1b;
  pcVar2 = (char *)malloc(10);
  (*scalar)->name = pcVar2;
  *(*scalar)->name = '\0';
  (*scalar)->name_capacity = 10;
  (*scalar)->datatype = AXB_REAL_DOUBLE;
  (*scalar)->memBackend = *handle->memBackends;
  (*scalar)->opBackend = *handle->opBackends;
  return 0;
}

Assistant:

axbStatus_t axbScalarCreateBegin(struct axbHandle_s *handle, struct axbScalar_s **scalar)
{
  *scalar = malloc(sizeof(struct axbScalar_s));
  (*scalar)->handle = handle;
  (*scalar)->init = 896283;

  // set defaults:
  (*scalar)->name = malloc(10);
  (*scalar)->name[0] = 0;
  (*scalar)->name_capacity = 10;

  (*scalar)->datatype = AXB_REAL_DOUBLE;
  (*scalar)->memBackend = handle->memBackends[0];
  (*scalar)->opBackend  = handle->opBackends[0];

  return 0;
}